

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::CapabilityStreamNetworkAddress::connectAuthenticated(CapabilityStreamNetworkAddress *this)

{
  _func_int *p_Var1;
  void *pvVar2;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  TransformPromiseNodeBase *this_00;
  CapabilityStreamNetworkAddress local_38;
  
  connect(&local_38,in_ESI,in_RDX,in_ECX);
  p_Var1 = local_38.super_NetworkAddress._vptr_NetworkAddress[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_38.super_NetworkAddress._vptr_NetworkAddress - (long)p_Var1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2794:25)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_00676f98;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    local_38.super_NetworkAddress._vptr_NetworkAddress[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_38.super_NetworkAddress._vptr_NetworkAddress + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2794:25)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_38.super_NetworkAddress._vptr_NetworkAddress[-5] = (_func_int *)&PTR_destroy_00676f98;
    local_38.super_NetworkAddress._vptr_NetworkAddress[-4] = p_Var1;
  }
  local_38.provider.ptr = (AsyncIoProvider *)0x0;
  (this->super_NetworkAddress)._vptr_NetworkAddress = (_func_int **)this_00;
  local_38.inner = (AsyncCapabilityStream *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38.inner);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38.provider);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> CapabilityStreamNetworkAddress::connectAuthenticated() {
  return connect().then([](Own<AsyncIoStream>&& stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}